

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::NodeIntStateIncrement
          (ChNodeFEAxyzDDD *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  
  uVar7 = (ulong)off_x;
  lVar1 = (x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((long)uVar7 < lVar1) {
    lVar2 = (Dv->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if ((long)(ulong)off_v < lVar2) {
      lVar3 = (x_new->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((long)uVar7 < lVar3) {
        pdVar4 = (x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar5 = (Dv->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar6 = (x_new->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v];
        uVar7 = (ulong)(off_x + 1);
        if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 1))) goto LAB_00669dbf;
        if ((long)uVar7 < lVar3) {
          pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 1];
          uVar7 = (ulong)(off_x + 2);
          if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 2))) goto LAB_00669dbf;
          if ((long)uVar7 < lVar3) {
            pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 2];
            uVar7 = (ulong)(off_x + 3);
            if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 3))) goto LAB_00669dbf;
            if ((long)uVar7 < lVar3) {
              pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 3];
              uVar7 = (ulong)(off_x + 4);
              if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 4))) goto LAB_00669dbf;
              if ((long)uVar7 < lVar3) {
                pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 4];
                uVar7 = (ulong)(off_x + 5);
                if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 5)))
                goto LAB_00669dbf;
                if ((long)uVar7 < lVar3) {
                  pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 5];
                  uVar7 = (ulong)(off_x + 6);
                  if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 6)))
                  goto LAB_00669dbf;
                  if ((long)uVar7 < lVar3) {
                    pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 6];
                    uVar7 = (ulong)(off_x + 7);
                    if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 7)))
                    goto LAB_00669dbf;
                    if ((long)uVar7 < lVar3) {
                      pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 7];
                      uVar7 = (ulong)(off_x + 8);
                      if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 8)))
                      goto LAB_00669dbf;
                      if ((long)uVar7 < lVar3) {
                        pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 8];
                        uVar7 = (ulong)(off_x + 9);
                        if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 9)))
                        goto LAB_00669dbf;
                        if ((long)uVar7 < lVar3) {
                          pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 9];
                          uVar7 = (ulong)(off_x + 10);
                          if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 10)))
                          goto LAB_00669dbf;
                          if ((long)uVar7 < lVar3) {
                            pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 10];
                            uVar7 = (ulong)(off_x + 0xb);
                            if ((lVar1 <= (long)uVar7) || (lVar2 <= (long)(ulong)(off_v + 0xb)))
                            goto LAB_00669dbf;
                            if ((long)uVar7 < lVar3) {
                              pdVar6[uVar7] = pdVar4[uVar7] + pdVar5[off_v + 0xb];
                              return;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
LAB_00669dbf:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntStateIncrement(const unsigned int off_x,
                                           ChState& x_new,
                                           const ChState& x,
                                           const unsigned int off_v,
                                           const ChStateDelta& Dv) {
    x_new(off_x + 0) = x(off_x + 0) + Dv(off_v + 0);
    x_new(off_x + 1) = x(off_x + 1) + Dv(off_v + 1);
    x_new(off_x + 2) = x(off_x + 2) + Dv(off_v + 2);
    x_new(off_x + 3) = x(off_x + 3) + Dv(off_v + 3);
    x_new(off_x + 4) = x(off_x + 4) + Dv(off_v + 4);
    x_new(off_x + 5) = x(off_x + 5) + Dv(off_v + 5);
    x_new(off_x + 6) = x(off_x + 6) + Dv(off_v + 6);
    x_new(off_x + 7) = x(off_x + 7) + Dv(off_v + 7);
    x_new(off_x + 8) = x(off_x + 8) + Dv(off_v + 8);
	x_new(off_x + 9) = x(off_x + 9) + Dv(off_v + 9);
	x_new(off_x + 10) = x(off_x + 10) + Dv(off_v + 10);
	x_new(off_x + 11) = x(off_x + 11) + Dv(off_v + 11);
}